

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<Fad<float>_>::Subtract
          (TPZMatrix<Fad<float>_> *this,TPZMatrix<Fad<float>_> *A,TPZMatrix<Fad<float>_> *res)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<Fad<float>_> *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fad<float> *pFVar5;
  Fad<float> *pFVar6;
  TPZMatrix<Fad<float>_> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  size_t in_stack_000001c8;
  char *in_stack_000001d0;
  int64_t c;
  int64_t r;
  TPZFMatrix<Fad<float>_> *resFmat;
  TPZFMatrix<Fad<float>_> *aFmat;
  TPZFMatrix<Fad<float>_> *thisFmat;
  long local_230;
  TPZMatrix<Fad<float>_> *pTVar7;
  Fad<float> *pFVar8;
  TPZBaseMatrix *pTVar9;
  Fad<float> *pFVar10;
  TPZFMatrix<Fad<float>_> *in_stack_fffffffffffffe00;
  undefined1 local_b0 [32];
  undefined1 local_90 [48];
  undefined1 local_60 [8];
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  long local_40;
  Fad<float> *local_38;
  TPZMatrix<Fad<float>_> *aBase;
  
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  iVar3 = TPZBaseMatrix::Rows(in_RSI);
  if (iVar2 == iVar3) {
    in_stack_fffffffffffffe00 = (TPZFMatrix<Fad<float>_> *)TPZBaseMatrix::Cols(in_RDI);
    pTVar4 = (TPZFMatrix<Fad<float>_> *)TPZBaseMatrix::Cols(in_RSI);
    if (in_stack_fffffffffffffe00 == pTVar4) goto LAB_0131cba9;
  }
  Error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
LAB_0131cba9:
  iVar1 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  aBase = (TPZMatrix<Fad<float>_> *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  if (aBase != (TPZMatrix<Fad<float>_> *)CONCAT44(extraout_var_00,iVar1)) {
    std::operator<<((ostream *)&std::cerr,
                    "void TPZMatrix<Fad<float>>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = Fad<float>]"
                   );
    std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_000001d0,in_stack_000001c8);
  }
  (*(in_RDX->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(in_RDX,in_RDI);
  if (in_RDI == (TPZBaseMatrix *)0x0) {
    pFVar5 = (Fad<float> *)0x0;
  }
  else {
    pFVar5 = (Fad<float> *)
             __dynamic_cast(in_RDI,&TPZMatrix<Fad<float>>::typeinfo,
                            &TPZFMatrix<Fad<float>>::typeinfo,0);
  }
  pTVar9 = in_RSI;
  pFVar10 = pFVar5;
  if (in_RSI == (TPZBaseMatrix *)0x0) {
    pFVar6 = (Fad<float> *)0x0;
  }
  else {
    pFVar6 = (Fad<float> *)
             __dynamic_cast(in_RSI,&TPZMatrix<Fad<float>>::typeinfo,
                            &TPZFMatrix<Fad<float>>::typeinfo,0);
  }
  pTVar7 = in_RDX;
  pFVar8 = pFVar6;
  if (in_RDX == (TPZMatrix<Fad<float>_> *)0x0) {
    local_230 = 0;
  }
  else {
    local_230 = __dynamic_cast(in_RDX,&TPZMatrix<Fad<float>>::typeinfo,
                               &TPZFMatrix<Fad<float>>::typeinfo,0);
  }
  if ((local_230 == 0) || ((pFVar5 != (Fad<float> *)0x0 && (pFVar6 != (Fad<float> *)0x0)))) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4a])(in_RDI,in_RDX,in_RSI);
    Storage(pTVar7);
    Storage(pTVar7);
    TPZFMatrix<Fad<float>_>::operator-=(in_stack_fffffffffffffe00,aBase);
    TPZFMatrixRef<Fad<float>_>::~TPZFMatrixRef((TPZFMatrixRef<Fad<float>_> *)0x131cfbf);
    TPZFMatrix<Fad<float>_>::~TPZFMatrix((TPZFMatrix<Fad<float>_> *)0x131cfcc);
  }
  else {
    for (local_38 = (Fad<float> *)0x0; iVar2 = TPZBaseMatrix::Rows(in_RDI), (long)local_38 < iVar2;
        local_38 = (Fad<float> *)((long)&local_38->val_ + 1)) {
      for (local_40 = 0; iVar2 = TPZBaseMatrix::Cols(in_RDI), local_40 < iVar2;
          local_40 = local_40 + 1) {
        pFVar5 = local_38;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_90);
        (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b0,in_RSI,local_38,local_40);
        operator-<Fad<float>,_Fad<float>,_nullptr>((Fad<float> *)pTVar9,pFVar8);
        Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
                  (pFVar10,(FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)pTVar9);
        (*(in_RDX->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (in_RDX,pFVar5,local_40,local_60);
        Fad<float>::~Fad(pFVar5);
        FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)pFVar5);
        Fad<float>::~Fad(pFVar5);
        Fad<float>::~Fad(pFVar5);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}